

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBExceedOffsetLimitTest *this,GLuint test_case_index,
          STAGES stage)

{
  pointer ptVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ulong uVar3;
  TestError *pTVar4;
  bool *text;
  size_t position;
  bool *local_60;
  GLint max_n_xfb_comp;
  GLchar *local_50;
  GLchar buffer [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar1[test_case_index].m_stage != stage) {
    switch(ptVar1[test_case_index].m_stage) {
    case VERTEX:
      break;
    case TESS_CTRL:
    case GEOMETRY:
      break;
    case TESS_EVAL:
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5d72);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar2 = (*((this->super_NegativeTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  max_n_xfb_comp = 0;
  position = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8c8a);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x5cfc);
  sprintf(buffer,"%d",(ulong)(uint)(max_n_xfb_comp << 2));
  uVar3 = (ulong)ptVar1[test_case_index].m_case;
  if (2 < uVar3) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x5d11);
LAB_00972bfa:
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (3 < stage - VERTEX) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x5d2a);
    goto LAB_00972bfa;
  }
  iVar2 = *(int *)(&DAT_01658b04 + uVar3 * 4);
  local_50 = *(GLchar **)(&DAT_01dc06e0 + uVar3 * 8);
  switch(stage) {
  case VERTEX:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    text = glcts::fixed_sample_locations_values + 1;
    local_60 = glcts::fixed_sample_locations_values + 1;
    goto LAB_00972b33;
  case TESS_CTRL:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    local_60 = (bool *)0x16d269c;
    goto LAB_00972b27;
  case TESS_EVAL:
    break;
  case GEOMETRY:
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  local_60 = (bool *)0x167134c;
LAB_00972b27:
  text = (bool *)0x184aaa4;
LAB_00972b33:
  Utils::replaceToken("VAR_DEFINITION",&position,&DAT_01658b04 + iVar2,__return_storage_ptr__);
  position = 0;
  Utils::replaceToken("SIZE",&position,buffer,__return_storage_ptr__);
  if (ptVar1[test_case_index].m_case != GLOBAL) {
    Utils::replaceToken("ARRAY",&position,text,__return_storage_ptr__);
  }
  Utils::replaceToken("VARIABLE_USE",&position,local_50,__return_storage_ptr__);
  Utils::replaceAllTokens("INDEX",local_60,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBExceedOffsetLimitTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* block_var_definition = "const uint max_size = SIZE;\n"
												"\n"
												"layout (xfb_buffer = 0, xfb_offset = max_size + 16) out Goku {\n"
												"    vec4 member;\n"
												"} gokuARRAY;\n";
	static const GLchar* global_var_definition = "const uint max_size = SIZE;\n"
												 "\n"
												 "layout (xfb_buffer = 0, xfb_stride = max_size + 16) out;\n";
	static const GLchar* vector_var_definition =
		"const uint max_size = SIZE;\n"
		"\n"
		"layout (xfb_buffer = 0, xfb_offset = max_size + 16) out vec4 gokuARRAY;\n";
	static const GLchar* block_use  = "    gokuINDEX.member = result / 2;\n";
	static const GLchar* global_use = "";
	static const GLchar* vector_use = "    gokuINDEX = result / 2;\n";
	static const GLchar* fs			= "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 gs_fs;\n"
							  "out vec4 fs_out;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    fs_out = gs_fs;\n"
							  "}\n"
							  "\n";
	static const GLchar* gs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 tes_gs[];\n"
									 "out vec4 gs_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = tes_gs[0];\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "}\n"
									 "\n";
	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "in  vec4 vs_tcs[];\n"
							   "out vec4 tcs_tes[];\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "\n"
							   "    tcs_tes[gl_InvocationID] = vs_tcs[gl_InvocationID];\n"
							   "\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";
	static const GLchar* tcs_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(vertices = 1) out;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 vs_tcs[];\n"
									  "out vec4 tcs_tes[];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = vs_tcs[gl_InvocationID];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tcs_tes[gl_InvocationID] = result;\n"
									  "\n"
									  "    gl_TessLevelOuter[0] = 1.0;\n"
									  "    gl_TessLevelOuter[1] = 1.0;\n"
									  "    gl_TessLevelOuter[2] = 1.0;\n"
									  "    gl_TessLevelOuter[3] = 1.0;\n"
									  "    gl_TessLevelInner[0] = 1.0;\n"
									  "    gl_TessLevelInner[1] = 1.0;\n"
									  "}\n"
									  "\n";
	static const GLchar* tes_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 tcs_tes[];\n"
									  "out vec4 tes_gs;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = tcs_tes[0];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tes_gs += result;\n"
									  "}\n"
									  "\n";
	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 in_vs;\n"
							  "out vec4 vs_tcs;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    vs_tcs = in_vs;\n"
							  "}\n"
							  "\n";
	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 in_vs;\n"
									 "out vec4 vs_tcs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = in_vs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    vs_tcs = result;\n"
									 "}\n"
									 "\n";

	std::string source;
	testCase&   test_case = m_test_cases[test_case_index];

	if (test_case.m_stage == stage)
	{
		const GLchar*	array = "";
		GLchar			 buffer[16];
		const Functions& gl				 = m_context.getRenderContext().getFunctions();
		const GLchar*	index			 = "";
		GLint			 max_n_xfb_comp  = 0;
		GLint			 max_n_xfb_bytes = 0;
		size_t			 position		 = 0;
		size_t			 temp;
		const GLchar*	var_definition = 0;
		const GLchar*	var_use		= 0;

		gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, &max_n_xfb_comp);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

		max_n_xfb_bytes = max_n_xfb_comp * 4;

		sprintf(buffer, "%d", max_n_xfb_bytes);

		switch (test_case.m_case)
		{
		case BLOCK:
			var_definition = block_var_definition;
			var_use		   = block_use;
			break;
		case GLOBAL:
			var_definition = global_var_definition;
			var_use		   = global_use;
			break;
		case VECTOR:
			var_definition = vector_var_definition;
			var_use		   = vector_use;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}
		// It is a compile time error to apply xfb_offset to the declaration of an unsized array(GLSL4.5 spec: Page73)
		// change array = "[]" to "[1]"
		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			source = gs_tested;
			array  = "[1]";
			index  = "[0]";
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs_tested;
			array  = "[1]";
			index  = "[gl_InvocationID]";
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes_tested;
			array  = "[1]";
			index  = "[0]";
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		temp = position;
		Utils::replaceToken("VAR_DEFINITION", position, var_definition, source);
		position = temp;
		Utils::replaceToken("SIZE", position, buffer, source);
		if (GLOBAL != test_case.m_case)
		{
			Utils::replaceToken("ARRAY", position, array, source);
		}
		Utils::replaceToken("VARIABLE_USE", position, var_use, source);

		Utils::replaceAllTokens("INDEX", index, source);
	}
	else
	{
		switch (test_case.m_stage)
		{
		case Utils::Shader::GEOMETRY:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_CTRL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_EVAL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::TESS_CTRL:
				source = tcs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::VERTEX:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			default:
				source = "";
			}
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}

	return source;
}